

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,double>
          (basic_appender<char> out,double value,format_specs specs,locale_ref loc)

{
  string_view bytes;
  locale_ref loc_00;
  locale_ref loc_01;
  format_specs specs_00;
  bool bVar1;
  presentation_type pVar2;
  align aVar3;
  sign s_00;
  basic_appender<char> bVar4;
  char *s_01;
  size_t count;
  size_t *in_RCX;
  long in_RDX;
  uchar *sig;
  basic_specs in_RSI;
  buffer<char> *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  double in_XMM0_Qa;
  format_specs *specs_01;
  big_decimal_fp f;
  int exp;
  memory_buffer buffer;
  decimal_fp<double> dec;
  int precision;
  int exp_upper;
  sign s;
  allocator<char> *in_stack_fffffffffffffc98;
  buffer<char> *this;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int exp_upper_00;
  sign in_stack_fffffffffffffcac;
  format_specs *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar5;
  basic_appender<char> in_stack_fffffffffffffcc8;
  sign local_314;
  undefined8 in_stack_fffffffffffffcf0;
  basic_specs in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  integral_constant local_2e9;
  sign local_2e8;
  undefined4 local_2e4;
  basic_string_view<char> local_2e0;
  buffer<char> *local_2d0;
  basic_specs local_2c8;
  long lStack_2c0;
  char local_2b5;
  buffer<char> *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  format_specs in_stack_fffffffffffffd68;
  double in_stack_fffffffffffffd90;
  buffer<char> *in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe57;
  format_specs *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  double in_stack_fffffffffffffe68;
  int local_68;
  basic_appender<char> local_60;
  basic_specs local_58;
  long local_50;
  buffer<char> *local_48;
  sign local_3c;
  double local_38;
  basic_specs local_28;
  undefined8 uStack_20;
  basic_appender<char> local_18;
  buffer<char> *local_10;
  
  local_38 = in_XMM0_Qa;
  local_28 = in_RSI;
  uStack_20 = in_RDX;
  local_18.container = in_RDI;
  bVar1 = std::signbit(in_XMM0_Qa);
  if (bVar1) {
    local_314 = minus;
  }
  else {
    local_314 = basic_specs::sign(&local_28,(EVP_PKEY_CTX *)in_RSI,sig,in_RCX,in_R8,in_R9);
  }
  local_3c = local_314;
  bVar1 = isfinite<double,_0>((double)in_stack_fffffffffffffca0);
  if (bVar1) {
    aVar3 = basic_specs::align(&local_28);
    if ((aVar3 == numeric) && (local_3c != none)) {
      getsign<char>(local_3c);
      local_60 = basic_appender<char>::operator++(&local_18,0);
      basic_appender<char>::operator*(&local_60);
      basic_appender<char>::operator=
                ((basic_appender<char> *)in_stack_fffffffffffffca0,
                 (char)((ulong)in_stack_fffffffffffffc98 >> 0x38));
      local_3c = none;
      if ((int)uStack_20 != 0) {
        uStack_20 = CONCAT44(uStack_20._4_4_,(int)uStack_20 + -1);
      }
    }
    local_68 = uStack_20._4_4_;
    if (uStack_20 < 0) {
      pVar2 = basic_specs::type(&local_28);
      if (pVar2 == none) {
        dragonbox::to_decimal<double>(in_stack_fffffffffffffd90);
        loc_00.locale_._4_4_ = in_stack_fffffffffffffcc4;
        loc_00.locale_._0_4_ = in_stack_fffffffffffffcc0;
        bVar4 = write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>>
                          (in_stack_fffffffffffffcc8,
                           (decimal_fp<double> *)
                           CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                           in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                           in_stack_fffffffffffffca8,loc_00);
        return (basic_appender<char>)bVar4.container;
      }
      local_68 = 6;
    }
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    pVar2 = basic_specs::type(&local_28);
    if (pVar2 == hex) {
      if (local_3c != none) {
        local_2b5 = getsign<char>(local_3c);
        buffer<char>::push_back
                  (&in_stack_fffffffffffffca0->super_buffer<char>,(char *)in_stack_fffffffffffffc98)
        ;
      }
      convert_float<double>(local_38);
      local_2c8 = local_28;
      lStack_2c0 = uStack_20;
      format_hexfloat<double,_0>
                ((double)in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
                 in_stack_fffffffffffffd58);
      local_2d0 = local_18.container;
      bVar4.container = (buffer<char> *)&stack0xfffffffffffffd60;
      s_01 = buffer<char>::data(bVar4.container);
      count = buffer<char>::size(bVar4.container);
      basic_string_view<char>::basic_string_view(&local_2e0,s_01,count);
      bytes.data_._4_4_ = in_stack_fffffffffffffcbc;
      bytes.data_._0_4_ = in_stack_fffffffffffffcb8;
      bytes.size_._0_4_ = in_stack_fffffffffffffcc0;
      bytes.size_._4_4_ = in_stack_fffffffffffffcc4;
      local_10 = (buffer<char> *)
                 write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
                           (bVar4,bytes,in_stack_fffffffffffffcb0);
    }
    else {
      pVar2 = basic_specs::type(&local_28);
      uVar5 = CONCAT13(pVar2,(int3)in_stack_fffffffffffffcc4);
      if (pVar2 == debug) {
        in_stack_fffffffffffffcbc = local_68;
        in_stack_fffffffffffffcc0 = max_value<int>();
        if (in_stack_fffffffffffffcbc == in_stack_fffffffffffffcc0) {
          report_error((char *)in_stack_fffffffffffffcb0);
        }
        local_68 = local_68 + 1;
        if (uStack_20._4_4_ != 0) {
          basic_specs::set_alt(&local_28);
        }
      }
      else {
        pVar2 = basic_specs::type(&local_28);
        in_stack_fffffffffffffcb8 = CONCAT13(pVar2,(int3)in_stack_fffffffffffffcb8);
        if (pVar2 == fixed) {
          if (uStack_20._4_4_ != 0) {
            basic_specs::set_alt(&local_28);
          }
        }
        else if (local_68 == 0) {
          local_68 = 1;
        }
      }
      specs_01 = (format_specs *)convert_float<double>(local_38);
      exp_upper_00 = local_68;
      std::integral_constant::operator_cast_to_bool(&local_2e9);
      s_00 = format_float<double>
                       (in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                        in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57,
                        in_stack_fffffffffffffe48);
      uStack_20 = CONCAT44(local_68,(int)uStack_20);
      this = (buffer<char> *)&stack0xfffffffffffffd60;
      local_2e8 = s_00;
      buffer<char>::data(this);
      buffer<char>::size(this);
      loc_01.locale_._4_4_ = uVar5;
      loc_01.locale_._0_4_ = in_stack_fffffffffffffcc0;
      local_10 = (buffer<char> *)
                 write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp>
                           (in_stack_fffffffffffffcc8,
                            (big_decimal_fp *)
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),specs_01,
                            s_00,exp_upper_00,loc_01);
    }
    local_2e4 = 1;
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x441f7e);
  }
  else {
    local_48 = local_18.container;
    isnan<double>(local_38);
    local_58 = local_28;
    local_50 = uStack_20;
    bVar4.container._4_4_ = in_stack_fffffffffffffd0c;
    bVar4.container._0_4_ = in_stack_fffffffffffffd08;
    specs_00.width = (int)in_stack_fffffffffffffd00;
    specs_00.precision = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
    specs_00.super_basic_specs = in_stack_fffffffffffffcf8;
    local_10 = (buffer<char> *)
               write_nonfinite<char,fmt::v11::basic_appender<char>>
                         (bVar4,SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x38,0),specs_00,
                          (sign)in_stack_fffffffffffffcf0);
  }
  return (basic_appender<char>)local_10;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}